

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O0

void __thiscall DPSprite::Serialize(DPSprite *this,FArchive *arc)

{
  FArchive *pFVar1;
  FArchive *arc_local;
  DPSprite *this_local;
  
  DObject::Serialize(&this->super_DObject,arc);
  pFVar1 = ::operator<<(arc,&this->Next);
  pFVar1 = ::operator<<(pFVar1,&this->Caller);
  pFVar1 = ::operator<<(pFVar1,&this->Owner);
  pFVar1 = FArchive::operator<<(pFVar1,&this->Flags);
  pFVar1 = ::operator<<(pFVar1,&this->State);
  pFVar1 = FArchive::operator<<(pFVar1,&this->Tics);
  pFVar1 = FArchive::operator<<(pFVar1,&this->Sprite);
  pFVar1 = FArchive::operator<<(pFVar1,&this->Frame);
  pFVar1 = FArchive::operator<<(pFVar1,&this->ID);
  pFVar1 = FArchive::operator<<(pFVar1,&this->x);
  pFVar1 = FArchive::operator<<(pFVar1,&this->y);
  pFVar1 = FArchive::operator<<(pFVar1,&this->oldx);
  FArchive::operator<<(pFVar1,&this->oldy);
  return;
}

Assistant:

void DPSprite::Serialize(FArchive &arc)
{
	Super::Serialize(arc);

	arc << Next << Caller << Owner << Flags
		<< State << Tics << Sprite << Frame
		<< ID << x << y << oldx << oldy;
}